

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

void inven_takeoff(object *obj)

{
  equip_slot **ppeVar1;
  ulong uVar2;
  uint16_t uVar3;
  player_upkeep *ppVar4;
  char cVar5;
  wchar_t wVar6;
  artifact_set *set;
  equip_slot **ppeVar7;
  player *ppVar8;
  char *pcVar9;
  char o_name [80];
  
  wVar6 = equipped_item_slot(player->body,obj);
  ppVar8 = player;
  if (wVar6 != (uint)(player->body).count) {
    if (obj->artifact != (artifact *)0x0) {
      set = check_sets(obj->artifact);
      if (set != (artifact_set *)0x0) {
        remove_set(set);
        ppVar8 = player;
      }
    }
    object_desc(o_name,0x50,obj,0x43,ppVar8);
    ppeVar1 = &(player->body).slots;
    ppeVar7 = &bodies->slots;
    if (player != (player *)0x0) {
      ppeVar7 = ppeVar1;
    }
    uVar3 = (*ppeVar7)[wVar6].type;
    if (uVar3 == 1) {
      pcVar9 = "You were wielding";
    }
    else if (uVar3 == 2) {
      pcVar9 = "You were holding";
    }
    else {
      pcVar9 = "You were wearing";
      if (uVar3 == 5) {
        pcVar9 = "You were holding";
      }
    }
    (*ppeVar1)[wVar6].obj = (object *)0x0;
    ppVar8 = player;
    ppVar4 = player->upkeep;
    ppVar4->equip_cnt = ppVar4->equip_cnt + L'\xffffffff';
    uVar2._0_4_ = ppVar4->notice;
    uVar2._4_4_ = ppVar4->update;
    ppVar4->notice = (int)(uVar2 | 0x44100000002);
    ppVar4->update = (int)((uVar2 | 0x44100000002) >> 0x20);
    update_stuff(ppVar8);
    cVar5 = gear_to_label(player,obj);
    msgt(0x80,"%s %s (%c).",pcVar9,o_name,(ulong)(uint)(int)cVar5);
  }
  return;
}

Assistant:

void inven_takeoff(struct object *obj)
{
	int slot = equipped_item_slot(player->body, obj);
	const char *act;
	char o_name[80];

	/* Paranoia */
	if (slot == player->body.count) return;

	/* Check to see if a set item is being removed */
	if (obj->artifact) {
		struct artifact_set *set = check_sets(obj->artifact);
		if (set) {
			remove_set(set);
		}
	}

	/* Describe the object */
	object_desc(o_name, sizeof(o_name), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Describe removal by slot */
	if (slot_type_is(player, slot, EQUIP_WEAPON))
		act = "You were wielding";
	else if (slot_type_is(player, slot, EQUIP_BOW))
		act = "You were holding";
	else if (slot_type_is(player, slot, EQUIP_LIGHT))
		act = "You were holding";
	else
		act = "You were wearing";

	/* De-equip the object */
	player->body.slots[slot].obj = NULL;
	player->upkeep->equip_cnt--;

	player->upkeep->update |= (PU_BONUS | PU_INVEN | PU_UPDATE_VIEW);
	player->upkeep->notice |= (PN_IGNORE);
	update_stuff(player);

	/* Message */
	msgt(MSG_WIELD, "%s %s (%c).", act, o_name, gear_to_label(player, obj));

	return;
}